

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aws_command_runner.cc
# Opt level: O2

string * __thiscall
AwsCommandRunner::GetFullUrl(string *__return_storage_ptr__,AwsCommandRunner *this,string *path)

{
  int iVar1;
  string *psVar2;
  allocator local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  psVar2 = (string *)((this->local_path_)._M_string_length - 1);
  iVar1 = std::__cxx11::string::compare((ulong)path,0,psVar2,(ulong)&this->local_path_,0);
  if (iVar1 == 0) {
    std::operator+(&local_40,"s3://",&this->s3_bucket_);
    std::__cxx11::string::string((string *)&local_60,(string *)path,(ulong)psVar2,&local_61);
    std::operator+(__return_storage_ptr__,&local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    return __return_storage_ptr__;
  }
  __assert_fail("path.compare(0, strip_length, local_path_, 0, strip_length) == 0 && \"Path does not start with the required prefix\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner.cc"
                ,0x35,"std::string AwsCommandRunner::GetFullUrl(const std::string &)");
}

Assistant:

std::string AwsCommandRunner::GetFullUrl(const std::string& path) {
  std::size_t strip_length = local_path_.size() - 1;
  assert(path.compare(0, strip_length, local_path_, 0, strip_length) == 0 &&
         "Path does not start with the required prefix");
  return "s3://" + s3_bucket_ + std::string(path, strip_length);
}